

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O2

int Fax3SetupState(TIFF *tif)

{
  uint uVar1;
  uint8_t *puVar2;
  tmsize_t s;
  void *pvVar3;
  size_t __n;
  char *fmt;
  int iVar4;
  int iVar5;
  size_t sVar6;
  Fax3CodecState *esp;
  bool bVar7;
  long lStack_40;
  
  if ((tif->tif_dir).td_bitspersample == 1) {
    puVar2 = tif->tif_data;
    if ((tif->tif_flags & 0x400) == 0) {
      s = TIFFScanlineSize(tif);
      lStack_40 = 0x58;
    }
    else {
      s = TIFFTileRowSize(tif);
      lStack_40 = 100;
    }
    uVar1 = *(uint *)((long)(tif->tif_dir).td_fieldsset + lStack_40 + -0x48);
    if (s < (long)((ulong)uVar1 + 7 >> 3)) {
      TIFFErrorExtR(tif,"Fax3SetupState",
                    "Inconsistent number of bytes per row : rowbytes=%ld rowpixels=%u",s);
      return 0;
    }
    *(tmsize_t *)(puVar2 + 8) = s;
    *(uint *)(puVar2 + 0x10) = uVar1;
    bVar7 = true;
    if ((puVar2[0x20] & 1) == 0) {
      bVar7 = (tif->tif_dir).td_compression == 4;
    }
    puVar2[0x60] = '\0';
    puVar2[0x61] = '\0';
    puVar2[0x62] = '\0';
    puVar2[99] = '\0';
    puVar2[100] = '\0';
    puVar2[0x65] = '\0';
    puVar2[0x66] = '\0';
    puVar2[0x67] = '\0';
    iVar4 = (uVar1 & 0xffffffe0) + 0x20;
    if (0xffffffdf < uVar1 + 1) {
      iVar4 = 0;
    }
    iVar5 = iVar4 * 2;
    if (iVar4 < 0) {
      iVar5 = 0;
    }
    if (!bVar7) {
      iVar5 = iVar4;
    }
    *(int *)(puVar2 + 0x68) = iVar5;
    if (iVar5 < 1) {
      TIFFErrorExtR(tif,tif->tif_name,"Row pixels integer overflow (rowpixels %u)",(ulong)uVar1);
      return 0;
    }
    pvVar3 = _TIFFCheckMalloc(tif,(ulong)(uint)(iVar5 * 2),4,"for Group 3/4 run arrays");
    *(void **)(puVar2 + 0x60) = pvVar3;
    if (pvVar3 == (void *)0x0) {
      return 0;
    }
    sVar6 = 0;
    __n = (ulong)*(uint *)(puVar2 + 0x68) << 3;
    if ((int)*(uint *)(puVar2 + 0x68) < 0) {
      __n = sVar6;
    }
    memset(pvVar3,0,__n);
    *(long *)(puVar2 + 0x78) = *(long *)(puVar2 + 0x60);
    if (bVar7) {
      sVar6 = *(long *)(puVar2 + 0x60) + (ulong)*(uint *)(puVar2 + 0x68) * 4;
    }
    *(size_t *)(puVar2 + 0x70) = sVar6;
    if (((tif->tif_dir).td_compression == 3) && ((puVar2[0x20] & 1) != 0)) {
      tif->tif_decoderow = Fax3Decode2D;
      tif->tif_decodestrip = Fax3Decode2D;
      tif->tif_decodetile = Fax3Decode2D;
    }
    puVar2 = tif->tif_data;
    if (bVar7) {
      pvVar3 = _TIFFmallocExt(tif,s);
      *(void **)(puVar2 + 0x88) = pvVar3;
      if (pvVar3 == (void *)0x0) {
        fmt = "No space for Group 3/4 reference line";
        goto LAB_00257283;
      }
    }
    else {
      puVar2[0x88] = '\0';
      puVar2[0x89] = '\0';
      puVar2[0x8a] = '\0';
      puVar2[0x8b] = '\0';
      puVar2[0x8c] = '\0';
      puVar2[0x8d] = '\0';
      puVar2[0x8e] = '\0';
      puVar2[0x8f] = '\0';
    }
    iVar4 = 1;
  }
  else {
    fmt = "Bits/sample must be 1 for Group 3/4 encoding/decoding";
LAB_00257283:
    iVar4 = 0;
    TIFFErrorExtR(tif,"Fax3SetupState",fmt);
  }
  return iVar4;
}

Assistant:

static int Fax3SetupState(TIFF *tif)
{
    static const char module[] = "Fax3SetupState";
    TIFFDirectory *td = &tif->tif_dir;
    Fax3BaseState *sp = Fax3State(tif);
    int needsRefLine;
    Fax3CodecState *dsp = (Fax3CodecState *)Fax3State(tif);
    tmsize_t rowbytes;
    uint32_t rowpixels;

    if (td->td_bitspersample != 1)
    {
        TIFFErrorExtR(tif, module,
                      "Bits/sample must be 1 for Group 3/4 encoding/decoding");
        return (0);
    }
    /*
     * Calculate the scanline/tile widths.
     */
    if (isTiled(tif))
    {
        rowbytes = TIFFTileRowSize(tif);
        rowpixels = td->td_tilewidth;
    }
    else
    {
        rowbytes = TIFFScanlineSize(tif);
        rowpixels = td->td_imagewidth;
    }
    if ((int64_t)rowbytes < ((int64_t)rowpixels + 7) / 8)
    {
        TIFFErrorExtR(tif, module,
                      "Inconsistent number of bytes per row : rowbytes=%" PRId64
                      " rowpixels=%" PRIu32,
                      (int64_t)rowbytes, rowpixels);
        return (0);
    }
    sp->rowbytes = rowbytes;
    sp->rowpixels = rowpixels;
    /*
     * Allocate any additional space required for decoding/encoding.
     */
    needsRefLine = ((sp->groupoptions & GROUP3OPT_2DENCODING) ||
                    td->td_compression == COMPRESSION_CCITTFAX4);

    /*
      Assure that allocation computations do not overflow.

      TIFFroundup and TIFFSafeMultiply return zero on integer overflow
    */
    dsp->runs = (uint32_t *)NULL;
    dsp->nruns = TIFFroundup_32(rowpixels + 1, 32);
    if (needsRefLine)
    {
        dsp->nruns = TIFFSafeMultiply(uint32_t, dsp->nruns, 2);
    }
    if ((dsp->nruns == 0) || (TIFFSafeMultiply(uint32_t, dsp->nruns, 2) == 0))
    {
        TIFFErrorExtR(tif, tif->tif_name,
                      "Row pixels integer overflow (rowpixels %" PRIu32 ")",
                      rowpixels);
        return (0);
    }
    dsp->runs = (uint32_t *)_TIFFCheckMalloc(
        tif, TIFFSafeMultiply(uint32_t, dsp->nruns, 2), sizeof(uint32_t),
        "for Group 3/4 run arrays");
    if (dsp->runs == NULL)
        return (0);
    memset(dsp->runs, 0,
           TIFFSafeMultiply(uint32_t, dsp->nruns, 2) * sizeof(uint32_t));
    dsp->curruns = dsp->runs;
    if (needsRefLine)
        dsp->refruns = dsp->runs + dsp->nruns;
    else
        dsp->refruns = NULL;
    if (td->td_compression == COMPRESSION_CCITTFAX3 && is2DEncoding(dsp))
    { /* NB: default is 1D routine */
        tif->tif_decoderow = Fax3Decode2D;
        tif->tif_decodestrip = Fax3Decode2D;
        tif->tif_decodetile = Fax3Decode2D;
    }

    if (needsRefLine)
    { /* 2d encoding */
        Fax3CodecState *esp = EncoderState(tif);
        /*
         * 2d encoding requires a scanline
         * buffer for the ``reference line''; the
         * scanline against which delta encoding
         * is referenced.  The reference line must
         * be initialized to be ``white'' (done elsewhere).
         */
        esp->refline = (unsigned char *)_TIFFmallocExt(tif, rowbytes);
        if (esp->refline == NULL)
        {
            TIFFErrorExtR(tif, module, "No space for Group 3/4 reference line");
            return (0);
        }
    }
    else /* 1d encoding */
        EncoderState(tif)->refline = NULL;

    return (1);
}